

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmByteArraySource::clone
          (CVmByteArraySource *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CVmByteArraySource *this_00;
  
  this_00 = (CVmByteArraySource *)operator_new(0x38);
  CVmByteArraySource(this_00,this->arr_id,this->start_idx,this->end_idx - this->start_idx);
  return (int)this_00;
}

Assistant:

CVmDataSource *clone(VMG_ const char * /*mode*/)
    {
        return new CVmByteArraySource(
            vmg_ arr_id, start_idx, end_idx - start_idx);
    }